

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helics-broker.cpp
# Opt level: O0

void terminalFunction(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args)

{
  App *pAVar1;
  App *pAVar2;
  App *variable;
  App *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  Option *this_00;
  undefined8 in_RDI;
  string cmdin;
  Option_group *qgroup2;
  App *qgroup1;
  App *querySub;
  anon_class_24_3_d85b1f57 queryCall;
  string query;
  string target;
  App *frestart;
  App *restart;
  helicsCLI11App termProg;
  bool cmdcont;
  anon_class_8_1_4ed96917 status;
  anon_class_16_2_2383fc7d restartBroker;
  anon_class_8_1_4ed96917_for_closeBroker closeBroker;
  __single_object broker;
  function<void_(unsigned_long)> *in_stack_fffffffffffff2f8;
  undefined6 in_stack_fffffffffffff300;
  undefined1 in_stack_fffffffffffff306;
  undefined1 in_stack_fffffffffffff307;
  function<void_()> *in_stack_fffffffffffff308;
  App *in_stack_fffffffffffff310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff318;
  allocator<char> *in_stack_fffffffffffff330;
  char *in_stack_fffffffffffff338;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 in_stack_fffffffffffff348;
  undefined1 value;
  App *in_stack_fffffffffffff350;
  string *group_description;
  string *in_stack_fffffffffffff3c8;
  string *group_name;
  bool *in_stack_fffffffffffff3d0;
  string *in_stack_fffffffffffff3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  App *in_stack_fffffffffffff3e0;
  helicsCLI11App *this_02;
  string *option_description;
  string *option_name;
  string *in_stack_fffffffffffff470;
  string *subcommand_description;
  string *in_stack_fffffffffffff478;
  string *subcommand_name;
  App *in_stack_fffffffffffff480;
  string local_af0 [64];
  App *local_ab0;
  undefined1 *local_aa8;
  allocator<char> local_a79 [40];
  allocator<char> local_a51;
  string *in_stack_fffffffffffff5b0;
  string *in_stack_fffffffffffff5b8;
  helicsCLI11App *in_stack_fffffffffffff5c0;
  allocator<char> local_a29 [40];
  allocator<char> local_a01 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9e0;
  allocator<char> local_9d1 [40];
  allocator<char> local_9a9 [40];
  allocator<char> local_981 [40];
  allocator<char> local_959 [33];
  App *local_938;
  allocator<char> local_929 [40];
  string local_901;
  App *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 *local_880;
  string local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_851;
  undefined1 local_829 [80];
  allocator<char> local_7d9 [40];
  allocator<char> local_7b1 [33];
  undefined1 **local_790;
  string local_788;
  string local_761;
  undefined1 local_739 [136];
  allocator<char> local_6b1 [41];
  undefined1 *local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  allocator<char> local_641 [40];
  string local_619;
  undefined8 local_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  string local_5e0;
  allocator<char> local_5b9 [40];
  allocator<char> local_591 [72];
  allocator<char> local_549 [40];
  allocator<char> local_521 [33];
  byte *local_500;
  allocator<char> local_4d1 [40];
  allocator<char> local_4a9 [40];
  allocator<char> local_481 [40];
  allocator<char> local_459 [40];
  allocator<char> local_431 [56];
  allocator<char> local_3f9 [33];
  undefined1 local_3d8 [935];
  byte local_31;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 local_10 [16];
  
  value = (undefined1)((ulong)in_stack_fffffffffffff348 >> 0x38);
  std::operator<<((ostream *)&std::cout,"starting broker\n");
  std::
  make_unique<helics::BrokerApp,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (in_stack_fffffffffffff318);
  local_31 = 1;
  local_30 = local_10;
  local_28 = local_10;
  uStack_20 = in_RDI;
  local_18 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  helics::helicsCLI11App::helicsCLI11App
            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_431);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_3f9);
  CLI::App::ignore_case(in_stack_fffffffffffff350,(bool)value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
             in_stack_fffffffffffff3c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_481);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  CLI::App::add_subcommand
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,in_stack_fffffffffffff470);
  local_500 = &local_31;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__0,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_8_1_b813364c *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x185c9b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_4d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  CLI::App::add_subcommand
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,in_stack_fffffffffffff470);
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__1&,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_8_1_4ed96917_for_closeBroker *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x185d9d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_549);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  pAVar1 = CLI::App::add_subcommand
                     (in_stack_fffffffffffff480,in_stack_fffffffffffff478,in_stack_fffffffffffff470)
  ;
  local_5f0 = local_18;
  local_5e8 = &local_31;
  subcommand_name = &local_5e0;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__2,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_16_2_33902604 *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x185ebf);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_5b9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_591);
  subcommand_description = &local_619;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  pAVar2 = CLI::App::add_subcommand(pAVar1,subcommand_name,subcommand_description);
  pAVar2 = CLI::App::allow_extras(pAVar2,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_641);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  local_688 = local_28;
  uStack_680 = uStack_20;
  local_678 = &local_5f8;
  local_5f8 = pAVar2;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__3,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_24_2_97660607 *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x18604b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  pAVar2 = CLI::App::add_subcommand(pAVar1,subcommand_name,subcommand_description);
  pAVar2 = CLI::App::allow_extras(pAVar2,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator((allocator<char> *)(local_739 + 0x60));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_6b1);
  local_739._33_8_ = local_28;
  local_739._41_8_ = uStack_20;
  local_739._49_8_ = &local_5f8;
  local_6b1._33_8_ = pAVar2;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__4,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_24_2_97660607 *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x1861a3);
  pAVar2 = (App *)local_739;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  option_name = &local_761;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  variable = CLI::App::add_subcommand(pAVar1,subcommand_name,subcommand_description);
  local_790 = &local_30;
  option_description = &local_788;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__5,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_8_1_6bf1c130 *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x186281);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator((allocator<char> *)local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  CLI::App::add_subcommand(pAVar1,subcommand_name,subcommand_description);
  local_829._33_8_ = &local_30;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__6,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_8_1_6bf1c130 *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x186393);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_7d9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_7b1);
  this_02 = (helicsCLI11App *)local_829;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  args_00 = &local_851;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  this = CLI::App::add_subcommand(pAVar1,subcommand_name,subcommand_description);
  local_880 = local_3d8;
  group_name = &local_878;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__7,void>
            ((function<void_()> *)in_stack_fffffffffffff310,
             (anon_class_8_1_a1786b64 *)in_stack_fffffffffffff308);
  CLI::App::callback(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  CLI::std::function<void_()>::~function((function<void_()> *)0x1864a5);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator((allocator<char> *)local_829);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff310);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff310);
  local_8d8 = local_10;
  group_description = &local_901;
  local_8d0 = local_8a0;
  local_8c8 = local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  pAVar1 = CLI::App::add_subcommand(pAVar1,subcommand_name,subcommand_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_929);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  local_8e0 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  pAVar1 = &CLI::App::add_option_group<CLI::Option_group>(this,group_name,group_description)->
            super_App;
  pAVar1 = CLI::App::enabled_by_default(pAVar1,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_981);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_959);
  local_938 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,option_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variable,
             option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_9d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  __a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CLI::App::add_option_group<CLI::Option_group>(this,group_name,group_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_a29);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_a01);
  __s = &local_a51;
  this_01 = __a;
  local_9e0 = __a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)__a);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (pAVar2,option_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variable
                       ,option_description);
  CLI::OptionBase<CLI::Option>::required(&this_00->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(local_a79);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::allocator<char>::~allocator(&local_a51);
  local_ab0 = local_938;
  local_aa8 = local_8a0;
  pAVar1 = local_8e0;
  std::function<void(unsigned_long)>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__8,void>
            ((function<void_(unsigned_long)> *)local_8e0,
             (anon_class_16_2_7f7a19e5 *)in_stack_fffffffffffff308);
  CLI::App::preparse_callback
            ((App *)CONCAT17(in_stack_fffffffffffff307,
                             CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)),
             in_stack_fffffffffffff2f8);
  CLI::std::function<void_(unsigned_long)>::~function((function<void_(unsigned_long)> *)0x1869c3);
  pAVar2 = local_8e0;
  std::function<void()>::
  function<terminalFunction(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__9&,void>
            ((function<void_()> *)pAVar1,(anon_class_24_3_d85b1f57 *)local_8e0);
  CLI::App::callback(pAVar1,(function<void_()> *)pAVar2);
  CLI::std::function<void_()>::~function((function<void_()> *)0x186a08);
  while ((local_31 & 1) != 0) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar1);
    std::operator<<((ostream *)&std::cout,"\nhelics_broker>>");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_af0);
    in_stack_fffffffffffff307 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff307,
                                  CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)),
                         (char *)in_stack_fffffffffffff2f8);
    if (((bool)in_stack_fffffffffffff307) ||
       (in_stack_fffffffffffff306 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff307,
                                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300))
                             ,(char *)in_stack_fffffffffffff2f8), (bool)in_stack_fffffffffffff306))
    {
      local_31 = 0;
    }
    else {
      helics::helicsCLI11App::helics_parse<std::__cxx11::string&>(this_02,args_00);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff307,
                        CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  helics::helicsCLI11App::~helicsCLI11App
            ((helicsCLI11App *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  CLI::std::unique_ptr<helics::BrokerApp,_std::default_delete<helics::BrokerApp>_>::~unique_ptr
            ((unique_ptr<helics::BrokerApp,_std::default_delete<helics::BrokerApp>_> *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  return;
}

Assistant:

void terminalFunction(std::vector<std::string> args)
{
    std::cout << "starting broker\n";
    auto broker = std::make_unique<helics::BrokerApp>(args);
    auto closeBroker = [&broker]() {
        if (!broker) {
            std::cout << "Broker has terminated\n";
            return;
        }
        broker->forceTerminate();
        while (broker->isConnected()) {
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
        }
        std::cout << "Broker has terminated\n";
    };

    auto restartBroker = [&broker, &args](const std::vector<std::string>& broker_args, bool force) {
        if (!broker_args.empty()) {
            args = broker_args;
        }
        if (!broker) {
            broker = std::make_unique<helics::BrokerApp>(args);
            std::cout << "broker has started\n";
        } else if (broker->isConnected()) {
            if (force) {
                broker->forceTerminate();
                broker = nullptr;
                broker = std::make_unique<helics::BrokerApp>(args);
                std::cout << "broker was forcibly terminated and restarted\n";
            } else {
                std::cout << "broker is currently running unable to restart\n";
            }
        } else {
            broker = nullptr;
            broker = std::make_unique<helics::BrokerApp>(args);
            std::cout << "broker has restarted\n";
        }
    };

    auto status = [&broker](bool addAddress) {
        if (!broker) {
            std::cout << "Broker is not available\n";
            return;
        }
        auto accepting = (*broker)->isOpenToNewFederates();
        auto connected = (*broker)->isConnected();
        auto id = (*broker)->getIdentifier();
        if (connected) {
            std::cout << "Broker (" << id << ") is connected and "
                      << ((accepting) ? "is" : "is not") << "accepting new federates\n";
            if (addAddress) {
                auto address = (*broker)->getAddress();
                std::cout << address << '\n';
            } else {
                auto cts = (*broker)->query("broker", "counts");
                std::cout << cts << '\n';
            }
        } else {
            std::cout << "Broker (" << id << ") is not connected \n";
        }
    };
    bool cmdcont = true;
    helics::helicsCLI11App termProg("helics broker command line terminal");
    termProg.ignore_case();
    termProg.add_flag("-q{false},--quit{false},--exit{false}",
                      cmdcont,
                      "close the terminal and wait for the broker to exit");
    termProg.add_subcommand("quit", "close the terminal and  wait for the broker to exit")
        ->callback([&cmdcont]() { cmdcont = false; });
    termProg.add_subcommand("terminate", "terminate the broker")->callback(closeBroker);

    termProg.add_subcommand("terminate!", "forcibly terminate the broker and exit")
        ->callback([closeBroker, &cmdcont]() {
            cmdcont = false;
            closeBroker();
        });

    auto* restart =
        termProg.add_subcommand("restart", "restart the broker if it is not currently executing")
            ->allow_extras();
    restart->callback([restartBroker, &restart]() {
        restartBroker(restart->remaining_for_passthrough(), false);
    });

    auto* frestart =
        termProg.add_subcommand("restart!", "forcibly terminate the broker and restart it")
            ->allow_extras();
    frestart->callback(
        [restartBroker, &restart]() { restartBroker(restart->remaining_for_passthrough(), true); });

    termProg.add_subcommand("status", "generate the current status of the broker")
        ->callback([&status]() { status(false); });
    termProg.add_subcommand("info", "get the current broker status and connection info")
        ->callback([&status]() { status(true); });
    termProg.add_subcommand("help", "display the help")->callback([&termProg]() {
        termProg.helics_parse("-?");
    });
    std::string target;
    std::string query;

    auto queryCall = [&broker, &target, &query]() {
        if (!broker) {
            std::cout << "Broker is not available\n";
            return;
        }
        std::string res;
        if (target.empty()) {
            res = (*broker)->query("broker", query);
        } else {
            res = (*broker)->query(target, query);
        }
        auto qvec = helics::vectorizeQueryResult(std::move(res));
        std::cout << "results: ";
        for (const auto& vres : qvec) {
            std::cout << vres << '\n';
        }
    };
    auto* querySub = termProg.add_subcommand(
        "query",
        "make a query of some target >>query <target> <query> or query <query> to query the broker");
    auto* qgroup1 = querySub->add_option_group("targetGroup")->enabled_by_default();
    qgroup1->add_option("target", target, "the name of object to target");
    auto* qgroup2 = querySub->add_option_group("queryGroup");
    qgroup2->add_option("query", query, "the query to make")->required();
    querySub->preparse_callback([qgroup1, &target](size_t argcount) {
        if (argcount < 2) {
            target.clear();
            qgroup1->disabled();
        }
    });
    querySub->callback(queryCall);
    while (cmdcont) {
        std::string cmdin;
        std::cout << "\nhelics_broker>>";
        std::getline(std::cin, cmdin);
        if (cmdin == "exit" || cmdin == "q") {  // provide a fast path to exit without going through
                                                // the terminal command line processor
            cmdcont = false;
            continue;
        }
        termProg.helics_parse(cmdin);
    }
}